

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3DecodeIntArray(int N,u32 *a,char *zBuf,int nBuf)

{
  char *pcVar1;
  int iVar2;
  sqlite_int64 local_38;
  sqlite3_int64 x;
  int local_28;
  int j;
  int i;
  int nBuf_local;
  char *zBuf_local;
  u32 *a_local;
  int N_local;
  
  local_28 = 0;
  a_local._4_4_ = N;
  zBuf_local = (char *)a;
  if ((nBuf != 0) && (((int)zBuf[nBuf + -1] & 0x80U) == 0)) {
    x._4_4_ = 0;
    j = nBuf;
    _i = zBuf;
    for (local_28 = 0; local_28 < a_local._4_4_ && x._4_4_ < j; local_28 = local_28 + 1) {
      iVar2 = sqlite3Fts3GetVarint(_i + x._4_4_,&local_38);
      x._4_4_ = iVar2 + x._4_4_;
      *(int *)(zBuf_local + (long)local_28 * 4) = (int)local_38;
    }
  }
  while (local_28 < a_local._4_4_) {
    pcVar1 = zBuf_local + (long)local_28 * 4;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

static void fts3DecodeIntArray(
  int N,             /* The number of integers to decode */
  u32 *a,            /* Write the integer values */
  const char *zBuf,  /* The BLOB containing the varints */
  int nBuf           /* size of the BLOB */
){
  int i = 0;
  if( nBuf && (zBuf[nBuf-1]&0x80)==0 ){
    int j;
    for(i=j=0; i<N && j<nBuf; i++){
      sqlite3_int64 x;
      j += sqlite3Fts3GetVarint(&zBuf[j], &x);
      a[i] = (u32)(x & 0xffffffff);
    }
  }
  while( i<N ) a[i++] = 0;
}